

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result wabt::GenerateNames(Module *module)

{
  Result RVar1;
  undefined1 local_90 [8];
  NameGenerator generator;
  Module *module_local;
  
  generator._112_8_ = module;
  anon_unknown_17::NameGenerator::NameGenerator((NameGenerator *)local_90);
  RVar1 = anon_unknown_17::NameGenerator::VisitModule
                    ((NameGenerator *)local_90,(Module *)generator._112_8_);
  anon_unknown_17::NameGenerator::~NameGenerator((NameGenerator *)local_90);
  return (Result)RVar1.enum_;
}

Assistant:

Result GenerateNames(Module* module) {
  NameGenerator generator;
  return generator.VisitModule(module);
}